

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O2

void __thiscall
google::protobuf::io::Printer::ValueImpl<false>::ValueImpl<true>
          (ValueImpl<false> *this,ValueImpl<true> *that)

{
  *(undefined8 *)
   &(this->value).
    super__Variant_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<bool_()>_>
    .super__Move_assign_alias<std::basic_string_view<char>,_std::function<bool_()>_>.
    super__Copy_assign_alias<std::basic_string_view<char>,_std::function<bool_()>_>.
    super__Move_ctor_alias<std::basic_string_view<char>,_std::function<bool_()>_>.
    super__Copy_ctor_alias<std::basic_string_view<char>,_std::function<bool_()>_>.
    super__Variant_storage_alias<std::basic_string_view<char>,_std::function<bool_()>_> = 0;
  *(undefined8 *)
   ((long)&(this->value).
           super__Variant_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<bool_()>_>
           .super__Move_assign_alias<std::basic_string_view<char>,_std::function<bool_()>_>.
           super__Copy_assign_alias<std::basic_string_view<char>,_std::function<bool_()>_>.
           super__Move_ctor_alias<std::basic_string_view<char>,_std::function<bool_()>_>.
           super__Copy_ctor_alias<std::basic_string_view<char>,_std::function<bool_()>_>.
           super__Variant_storage_alias<std::basic_string_view<char>,_std::function<bool_()>_> + 8)
       = 0;
  *(__index_type *)
   ((long)&(this->value).
           super__Variant_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<bool_()>_>
           .super__Move_assign_alias<std::basic_string_view<char>,_std::function<bool_()>_>.
           super__Copy_assign_alias<std::basic_string_view<char>,_std::function<bool_()>_>.
           super__Move_ctor_alias<std::basic_string_view<char>,_std::function<bool_()>_>.
           super__Copy_ctor_alias<std::basic_string_view<char>,_std::function<bool_()>_>.
           super__Variant_storage_alias<std::basic_string_view<char>,_std::function<bool_()>_> +
   0x20) = '\0';
  (this->consume_after)._M_dataplus._M_p = (pointer)&(this->consume_after).field_2;
  (this->consume_after)._M_string_length = 0;
  (this->consume_after).field_2._M_local_buf[0] = '\0';
  this->consume_parens_if_empty = false;
  operator=(this,that);
  return;
}

Assistant:

ValueImpl(const ValueImpl<that_owned>& that) {  // NOLINT
    *this = that;
  }